

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O3

void __thiscall
io::net::dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_>::consume
          (dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_> *this,size_t n
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ResultBuilder *pRVar2;
  undefined1 auStack_310 [44];
  int iStack_2e4;
  _Alloc_hider _Stack_2e0;
  undefined8 uStack_2d8;
  ResultBuilder RStack_2c8;
  
  pbVar1 = this->str_;
  if (this->size_ < n) {
    n = this->size_;
  }
  if (n <= pbVar1->_M_string_length) {
    pbVar1->_M_string_length = n;
    (pbVar1->_M_dataplus)._M_p[n] = '\0';
    this->size_ = this->size_ - n;
    return;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)auStack_310,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/string_view_stream_test.cpp"
             ,0x19);
  Catch::ResultBuilder::ResultBuilder
            (&RStack_2c8,"REQUIRE",(SourceLineInfo *)auStack_310,"d.str() == \"\"",Normal,"");
  if ((ResultBuilder *)auStack_310._0_8_ != (ResultBuilder *)(auStack_310 + 0x10)) {
    operator_delete((void *)auStack_310._0_8_,auStack_310._16_8_ + 1);
  }
  _Stack_2e0._M_p = (pointer)0x0;
  uStack_2d8 = 0;
  auStack_310._0_8_ = &RStack_2c8;
  auStack_310._8_8_ = &_Stack_2e0;
  pRVar2 = Catch::ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&>::
           captureExpression<(Catch::Internal::Operator)0,char[1]>
                     ((ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&> *)
                      auStack_310,(char (*) [1])0x1705ad);
  Catch::ResultBuilder::endExpression(pRVar2);
  Catch::ResultBuilder::shouldDebugBreak(&RStack_2c8);
  Catch::ResultBuilder::react(&RStack_2c8);
  Catch::ResultBuilder::~ResultBuilder(&RStack_2c8);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)auStack_310,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/string_view_stream_test.cpp"
             ,0x1a);
  Catch::ResultBuilder::ResultBuilder
            (&RStack_2c8,"REQUIRE",(SourceLineInfo *)auStack_310,
             "d.get_position().offset_from_start() == 0",Normal,"");
  if ((ResultBuilder *)auStack_310._0_8_ != (ResultBuilder *)(auStack_310 + 0x10)) {
    operator_delete((void *)auStack_310._0_8_,auStack_310._16_8_ + 1);
  }
  _Stack_2e0._M_p = (pointer)0x0;
  iStack_2e4 = 0;
  auStack_310._0_8_ = &RStack_2c8;
  auStack_310._8_8_ = &_Stack_2e0;
  pRVar2 = Catch::ExpressionLhs<long_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<long_const&> *)auStack_310,&iStack_2e4);
  Catch::ResultBuilder::endExpression(pRVar2);
  Catch::ResultBuilder::shouldDebugBreak(&RStack_2c8);
  Catch::ResultBuilder::react(&RStack_2c8);
  Catch::ResultBuilder::~ResultBuilder(&RStack_2c8);
  return;
}

Assistant:

void consume(std::size_t n)
    {
        std::size_t m = std::min(n, size_);
        str_.erase(m);
        size_ -= m;
    }